

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR MAPRecordMapping(IPalObject *pMappingObject,void *pPEBaseAddress,void *addr,size_t len,
                          int prot)

{
  DWORD DVar1;
  _LIST_ENTRY *p_Var2;
  PLIST_ENTRY _EX_ListHead;
  PLIST_ENTRY _EX_Blink;
  PMAPPED_VIEW_LIST pNewView;
  PAL_ERROR palError;
  int prot_local;
  size_t len_local;
  void *addr_local;
  void *pPEBaseAddress_local;
  IPalObject *pMappingObject_local;
  
  if (pPEBaseAddress == (void *)0x0) {
    pMappingObject_local._4_4_ = 0x54f;
  }
  else {
    pNewView._0_4_ = 0;
    p_Var2 = (_LIST_ENTRY *)CorUnix::InternalMalloc(0x38);
    if (p_Var2 == (_LIST_ENTRY *)0x0) {
      pNewView._0_4_ = 0x54f;
    }
    else {
      p_Var2[1].Blink = (_LIST_ENTRY *)addr;
      p_Var2[2].Flink = (_LIST_ENTRY *)len;
      DVar1 = MAPMmapProtToAccessFlags(prot);
      *(DWORD *)&p_Var2[2].Blink = DVar1;
      (*pMappingObject->_vptr_IPalObject[7])();
      p_Var2[1].Flink = (_LIST_ENTRY *)pMappingObject;
      p_Var2[3].Flink = (_LIST_ENTRY *)pPEBaseAddress;
      p_Var2->Flink = &MappedViewList;
      p_Var2->Blink = MappedViewList.Blink;
      (MappedViewList.Blink)->Flink = p_Var2;
      MappedViewList.Blink = p_Var2;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    pMappingObject_local._4_4_ = (PAL_ERROR)pNewView;
  }
  return pMappingObject_local._4_4_;
}

Assistant:

static PAL_ERROR
MAPRecordMapping(
    IPalObject *pMappingObject,
    void *pPEBaseAddress,
    void *addr,
    size_t len,
    int prot
    )
{
    if (pPEBaseAddress == NULL)
    {
        return ERROR_INTERNAL_ERROR;
    }

    PAL_ERROR palError = NO_ERROR;
    PMAPPED_VIEW_LIST pNewView;
    pNewView = (PMAPPED_VIEW_LIST)InternalMalloc(sizeof(*pNewView));
    if (NULL != pNewView)
    {
        pNewView->lpAddress = addr;
        pNewView->NumberOfBytesToMap = len;
        pNewView->dwDesiredAccess = MAPMmapProtToAccessFlags(prot);
        pMappingObject->AddReference();
        pNewView->pFileMapping = pMappingObject;
        pNewView->lpPEBaseAddress = pPEBaseAddress;
        InsertTailList(&MappedViewList, &pNewView->Link);

        TRACE_(LOADER)("Added address %p, size 0x%x, to the mapped file list.\n", addr, len);
    }
    else
    {
        palError = ERROR_INTERNAL_ERROR;
    }

    return palError;
}